

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_getinfo(lua_State *L)

{
  TValue *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  lua_State *L_00;
  lua_Integer lVar5;
  char *local_120;
  char *options;
  lua_State *L1;
  int opt_L;
  int opt_f;
  int arg;
  lj_Debug ar;
  lua_State *L_local;
  
  bVar3 = false;
  bVar2 = false;
  ar._120_8_ = L;
  L_00 = getthread(L,&opt_L);
  local_120 = luaL_optlstring((lua_State *)ar._120_8_,opt_L + 2,"flnSu",(size_t *)0x0);
  iVar4 = lua_isnumber((lua_State *)ar._120_8_,opt_L + 1);
  if (iVar4 == 0) {
    if ((*(ulong *)(ar._120_8_ + 0x28) <= (ulong)(*(long *)(ar._120_8_ + 0x20) + (long)opt_L * 8))
       || ((int)((long)*(undefined8 *)(*(long *)(ar._120_8_ + 0x20) + (long)opt_L * 8) >> 0x2f) !=
           -9)) {
      lj_err_arg((lua_State *)ar._120_8_,opt_L + 1,LJ_ERR_NOFUNCL);
    }
    local_120 = lua_pushfstring((lua_State *)ar._120_8_,">%s",local_120);
    pTVar1 = L_00->top;
    L_00->top = pTVar1 + 1;
    pTVar1->u64 = *(ulong *)(*(long *)(ar._120_8_ + 0x20) + (long)opt_L * 8) & 0x7fffffffffff |
                  0xfffb800000000000;
  }
  else {
    lVar5 = lua_tointeger((lua_State *)ar._120_8_,opt_L + 1);
    iVar4 = lua_getstack(L_00,(int)lVar5,(lua_Debug *)&opt_f);
    if (iVar4 == 0) {
      *(undefined8 *)(*(long *)(ar._120_8_ + 0x28) + -8) = 0xffffffffffffffff;
      return 1;
    }
  }
  iVar4 = lj_debug_getinfo(L_00,local_120,(lj_Debug *)&opt_f,1);
  if (iVar4 != 0) {
    lua_createtable((lua_State *)ar._120_8_,0,0x10);
    for (; *local_120 != '\0'; local_120 = local_120 + 1) {
      switch(*local_120) {
      case 'L':
        bVar2 = true;
        break;
      default:
        break;
      case 'S':
        settabss((lua_State *)ar._120_8_,"source",ar.what);
        settabss((lua_State *)ar._120_8_,"short_src",(char *)&ar.linedefined);
        settabsi((lua_State *)ar._120_8_,"linedefined",ar.currentline);
        settabsi((lua_State *)ar._120_8_,"lastlinedefined",ar.nups);
        settabss((lua_State *)ar._120_8_,"what",ar.namewhat);
        break;
      case 'f':
        bVar3 = true;
        break;
      case 'l':
        settabsi((lua_State *)ar._120_8_,"currentline",(int)ar.source);
        break;
      case 'n':
        settabss((lua_State *)ar._120_8_,"name",(char *)ar._0_8_);
        settabss((lua_State *)ar._120_8_,"namewhat",ar.name);
        break;
      case 'u':
        settabsi((lua_State *)ar._120_8_,"nups",ar.source._4_4_);
        settabsi((lua_State *)ar._120_8_,"nparams",ar.short_src._56_4_);
        settabsb((lua_State *)ar._120_8_,"isvararg",ar.i_ci);
      }
    }
    if (bVar2) {
      treatstackoption((lua_State *)ar._120_8_,L_00,"activelines");
    }
    if (bVar3) {
      treatstackoption((lua_State *)ar._120_8_,L_00,"func");
    }
    return 1;
  }
  lj_err_arg((lua_State *)ar._120_8_,opt_L + 2,LJ_ERR_INVOPT);
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}